

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

void opj_t1_dec_clnpass(opj_t1_t *t1,OPJ_INT32 bpno,OPJ_INT32 cblksty)

{
  OPJ_BYTE **ppOVar1;
  OPJ_UINT32 *pOVar2;
  byte *pbVar3;
  opj_mqc_state_t **ppoVar4;
  opj_mqc_state_t **ppoVar5;
  byte bVar6;
  opj_mqc_state_t *poVar7;
  OPJ_BYTE *pOVar8;
  ulong uVar9;
  uint *puVar10;
  uint *puVar11;
  uint uVar12;
  ulong uVar13;
  opj_flag_t *flagsp;
  OPJ_INT32 *data;
  uint *puVar14;
  opj_mqc_state_t **ppoVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint *puVar23;
  OPJ_UINT32 c;
  OPJ_UINT32 OVar24;
  uint uVar25;
  OPJ_UINT32 OVar26;
  uint uVar27;
  uint uVar28;
  OPJ_UINT32 OVar29;
  opj_mqc_t *mqc_2;
  ulong uVar30;
  OPJ_UINT32 OVar31;
  uint uVar32;
  OPJ_UINT32 i;
  int iVar33;
  bool bVar34;
  opj_mqc_t *mqc;
  OPJ_INT32 oneplushalf;
  
  uVar12 = t1->w;
  uVar30 = (ulong)uVar12;
  if ((uVar30 == 0x40) && (t1->h == 0x40)) {
    puVar10 = t1->flags + 0x43;
    uVar16 = (uint)(1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
    ppOVar1 = &(t1->mqc).bp;
    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
    uVar17 = -uVar16;
    ppoVar4 = (t1->mqc).ctxs + 0x11;
    ppoVar5 = (t1->mqc).ctxs + 0x12;
    puVar14 = (uint *)t1->data;
    ppoVar15 = (t1->mqc).curctx;
    OVar24 = (t1->mqc).c;
    uVar12 = (t1->mqc).a;
    OVar29 = (t1->mqc).ct;
    if ((cblksty & 8U) != 0) {
      uVar27 = 0;
LAB_001316d6:
      iVar33 = 0;
LAB_001316de:
      puVar23 = puVar14;
      puVar11 = puVar10;
      uVar25 = *puVar11;
      uVar30 = (ulong)uVar25;
      if (uVar30 != 0) {
        if ((uVar25 & 0x200010) == 0) {
          bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
          ppoVar15 = (t1->mqc).ctxs + bVar6;
          poVar7 = (t1->mqc).ctxs[bVar6];
          uVar20 = poVar7->qeval;
          uVar12 = uVar12 - uVar20;
          if (OVar24 >> 0x10 < uVar20) {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar20 > uVar12) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
            uVar12 = uVar20;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_00131793;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_00131793:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar20 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar18 = poVar7->mps;
            }
            else {
              uVar18 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar20) {
                uVar18 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_00131963;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_00131963:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          if (uVar18 != 0) {
            uVar18 = uVar25 >> 0x10 & 0x40 | uVar25 & 0xaa | uVar25 >> 0xe & 0x10 |
                     puVar11[-1] >> 0x13 & 1 | puVar11[1] >> 0x11 & 4;
            ppoVar15 = (t1->mqc).ctxs +
                       "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                       [uVar18];
            poVar7 = *ppoVar15;
            uVar20 = poVar7->qeval;
            uVar12 = uVar12 - uVar20;
            if (OVar24 >> 0x10 < uVar20) {
              uVar32 = (uint)(poVar7->mps == 0);
              if (uVar20 > uVar12) {
                uVar32 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
              uVar12 = uVar20;
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_00131bbe;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_00131bbe:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
            else {
              OVar24 = OVar24 + uVar20 * -0x10000;
              if ((short)uVar12 < 0) {
                uVar32 = poVar7->mps;
              }
              else {
                uVar32 = (uint)(poVar7->mps == 0);
                if (uVar12 >= uVar20) {
                  uVar32 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
                do {
                  if (OVar29 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar24 = OVar24 + (uint)bVar6 * 0x200;
                        OVar29 = 7;
                        goto LAB_00131c68;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x100;
                    }
                    OVar29 = 8;
                  }
LAB_00131c68:
                  uVar12 = uVar12 * 2;
                  OVar24 = OVar24 * 2;
                  OVar29 = OVar29 - 1;
                } while (uVar12 < 0x8000);
              }
            }
            bVar6 = ""[uVar18];
            uVar20 = uVar17;
            if (uVar32 == bVar6) {
              uVar20 = uVar16;
            }
            *puVar23 = uVar20;
            *(byte *)(puVar11 + -1) = (byte)puVar11[-1] | 0x20;
            *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 8;
            uVar30 = (ulong)((uVar32 ^ bVar6) << 0x13 | uVar25 | 0x10);
          }
        }
        if ((uVar30 & 0x1000080) == 0) {
          uVar20 = (uint)(uVar30 >> 3);
          bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar20 & 0x1ef];
          ppoVar15 = (t1->mqc).ctxs + bVar6;
          poVar7 = (t1->mqc).ctxs[bVar6];
          uVar25 = poVar7->qeval;
          uVar12 = uVar12 - uVar25;
          if (OVar24 >> 0x10 < uVar25) {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar25 > uVar12) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
            uVar12 = uVar25;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_00131fd5;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_00131fd5:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar25 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar18 = poVar7->mps;
            }
            else {
              uVar18 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar25) {
                uVar18 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_00132075;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_00132075:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          if (uVar18 != 0) {
            uVar20 = (uint)(uVar30 >> 0x13) & 0x40 | uVar20 & 0xaa | (uint)(uVar30 >> 0xf) & 0x10 |
                     puVar11[-1] >> 0x16 & 1 | puVar11[1] >> 0x14 & 4;
            ppoVar15 = (t1->mqc).ctxs +
                       "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                       [uVar20];
            poVar7 = *ppoVar15;
            uVar25 = poVar7->qeval;
            uVar12 = uVar12 - uVar25;
            if (OVar24 >> 0x10 < uVar25) {
              uVar18 = (uint)(poVar7->mps == 0);
              if (uVar25 > uVar12) {
                uVar18 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
              uVar12 = uVar25;
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_00132180;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_00132180:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
            else {
              OVar24 = OVar24 + uVar25 * -0x10000;
              if ((short)uVar12 < 0) {
                uVar18 = poVar7->mps;
              }
              else {
                uVar18 = (uint)(poVar7->mps == 0);
                if (uVar12 >= uVar25) {
                  uVar18 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
                do {
                  if (OVar29 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar24 = OVar24 + (uint)bVar6 * 0x200;
                        OVar29 = 7;
                        goto LAB_00132220;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x100;
                    }
                    OVar29 = 8;
                  }
LAB_00132220:
                  uVar12 = uVar12 * 2;
                  OVar24 = OVar24 * 2;
                  OVar29 = OVar29 - 1;
                } while (uVar12 < 0x8000);
              }
            }
            bVar6 = ""[uVar20];
            uVar25 = uVar17;
            if (uVar18 == bVar6) {
              uVar25 = uVar16;
            }
            puVar23[0x40] = uVar25;
            *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 1;
            uVar30 = (ulong)((uint)uVar30 | (uVar18 ^ bVar6) << 0x16 | 0x80);
            *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 0x40;
          }
        }
        if ((uVar30 & 0x8000400) == 0) {
          uVar20 = (uint)(uVar30 >> 6);
          bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar20 & 0x1ef];
          ppoVar15 = (t1->mqc).ctxs + bVar6;
          poVar7 = (t1->mqc).ctxs[bVar6];
          uVar25 = poVar7->qeval;
          uVar12 = uVar12 - uVar25;
          if (OVar24 >> 0x10 < uVar25) {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar25 > uVar12) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
            uVar12 = uVar25;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0013233f;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0013233f:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar25 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar18 = poVar7->mps;
            }
            else {
              uVar18 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar25) {
                uVar18 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_001323da;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_001323da:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          if (uVar18 != 0) {
            uVar20 = (uint)(uVar30 >> 0x16) & 0x40 | uVar20 & 0xaa | (uint)(uVar30 >> 0x12) & 0x10 |
                     puVar11[-1] >> 0x19 & 1 | puVar11[1] >> 0x17 & 4;
            ppoVar15 = (t1->mqc).ctxs +
                       "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                       [uVar20];
            poVar7 = *ppoVar15;
            uVar25 = poVar7->qeval;
            uVar12 = uVar12 - uVar25;
            if (OVar24 >> 0x10 < uVar25) {
              uVar18 = (uint)(poVar7->mps == 0);
              if (uVar25 > uVar12) {
                uVar18 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
              uVar12 = uVar25;
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_001324d6;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_001324d6:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
            else {
              OVar24 = OVar24 + uVar25 * -0x10000;
              if ((short)uVar12 < 0) {
                uVar18 = poVar7->mps;
              }
              else {
                uVar18 = (uint)(poVar7->mps == 0);
                if (uVar12 >= uVar25) {
                  uVar18 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
                do {
                  if (OVar29 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar24 = OVar24 + (uint)bVar6 * 0x200;
                        OVar29 = 7;
                        goto LAB_00132580;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x100;
                    }
                    OVar29 = 8;
                  }
LAB_00132580:
                  uVar12 = uVar12 * 2;
                  OVar24 = OVar24 * 2;
                  OVar29 = OVar29 - 1;
                } while (uVar12 < 0x8000);
              }
            }
            bVar6 = ""[uVar20];
            uVar25 = uVar17;
            if (uVar18 == bVar6) {
              uVar25 = uVar16;
            }
            puVar23[0x80] = uVar25;
            *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 8;
            uVar30 = (ulong)((uint)uVar30 | (uVar18 ^ bVar6) << 0x19 | 0x400);
            *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 2;
          }
        }
        uVar25 = (uint)uVar30;
        if ((uVar30 & 0x40002000) == 0) {
          uVar18 = (uint)(uVar30 >> 9);
          bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar18 & 0x1ef];
          ppoVar15 = (t1->mqc).ctxs + bVar6;
          poVar7 = (t1->mqc).ctxs[bVar6];
          uVar20 = poVar7->qeval;
          uVar12 = uVar12 - uVar20;
          if (OVar24 >> 0x10 < uVar20) {
            uVar32 = (uint)(poVar7->mps == 0);
            if (uVar20 > uVar12) {
              uVar32 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
            uVar12 = uVar20;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0013269f;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0013269f:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar20 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar32 = poVar7->mps;
            }
            else {
              uVar32 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar20) {
                uVar32 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_0013273f;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_0013273f:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          if (uVar32 != 0) {
            uVar18 = (uint)(uVar30 >> 0x19) & 0x40 | uVar18 & 0xaa | (uint)(uVar30 >> 0x15) & 0x10 |
                     puVar11[-1] >> 0x1c & 1 | puVar11[1] >> 0x1a & 4;
            ppoVar15 = (t1->mqc).ctxs +
                       "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                       [uVar18];
            poVar7 = *ppoVar15;
            uVar20 = poVar7->qeval;
            uVar12 = uVar12 - uVar20;
            if (OVar24 >> 0x10 < uVar20) {
              uVar32 = (uint)(poVar7->mps == 0);
              if (uVar20 > uVar12) {
                uVar32 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
              uVar12 = uVar20;
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_00132840;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_00132840:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
            else {
              OVar24 = OVar24 + uVar20 * -0x10000;
              if ((short)uVar12 < 0) {
                uVar32 = poVar7->mps;
              }
              else {
                uVar32 = (uint)(poVar7->mps == 0);
                if (uVar12 >= uVar20) {
                  uVar32 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
                do {
                  if (OVar29 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar24 = OVar24 + (uint)bVar6 * 0x200;
                        OVar29 = 7;
                        goto LAB_001328e5;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x100;
                    }
                    OVar29 = 8;
                  }
LAB_001328e5:
                  uVar12 = uVar12 * 2;
                  OVar24 = OVar24 * 2;
                  OVar29 = OVar29 - 1;
                } while (uVar12 < 0x8000);
              }
            }
            uVar19 = uVar32 ^ ""[uVar18];
            uVar20 = uVar17;
            if (uVar32 == ""[uVar18]) {
              uVar20 = uVar16;
            }
            puVar23[0xc0] = uVar20;
            *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 0x40;
            *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 0x10;
            puVar11[0x42] = uVar19 << 0x12 | puVar11[0x42] | 2;
            *(byte *)(puVar11 + 0x41) = (byte)puVar11[0x41] | 4;
            uVar25 = uVar25 | uVar19 << 0x1c | 0x2000;
            *(byte *)(puVar11 + 0x43) = (byte)puVar11[0x43] | 1;
          }
        }
LAB_001334a3:
        *puVar11 = uVar25 & 0xb6dfffff;
        goto LAB_001334ad;
      }
      poVar7 = *ppoVar4;
      uVar25 = poVar7->qeval;
      uVar12 = uVar12 - uVar25;
      if (OVar24 >> 0x10 < uVar25) {
        uVar20 = (uint)(poVar7->mps == 0);
        if (uVar25 > uVar12) {
          uVar20 = poVar7->mps;
        }
        *ppoVar4 = (&poVar7->nmps)[uVar25 <= uVar12];
        uVar12 = uVar25;
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_00131834;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_00131834:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
      else {
        OVar24 = OVar24 + uVar25 * -0x10000;
        if ((short)uVar12 < 0) {
          uVar20 = poVar7->mps;
        }
        else {
          uVar20 = (uint)(poVar7->mps == 0);
          if (uVar12 >= uVar25) {
            uVar20 = poVar7->mps;
          }
          *ppoVar4 = (&poVar7->nmps)[uVar12 < uVar25];
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_001318c8;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_001318c8:
            uVar12 = uVar12 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar12 < 0x8000);
        }
      }
      if (uVar20 != 0) {
        poVar7 = *ppoVar5;
        uVar25 = poVar7->qeval;
        uVar12 = uVar12 - uVar25;
        if (OVar24 >> 0x10 < uVar25) {
          OVar26 = (uint)(poVar7->mps == 0);
          if (uVar25 > uVar12) {
            OVar26 = poVar7->mps;
          }
          *ppoVar5 = (&poVar7->nmps)[uVar25 <= uVar12];
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_00131a18;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_00131a18:
            uVar25 = uVar25 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar25 < 0x8000);
        }
        else {
          OVar24 = OVar24 + uVar25 * -0x10000;
          if ((short)uVar12 < 0) {
            OVar26 = poVar7->mps;
            uVar25 = uVar12;
          }
          else {
            OVar26 = (uint)(poVar7->mps == 0);
            if (uVar12 >= uVar25) {
              OVar26 = poVar7->mps;
            }
            *ppoVar5 = (&poVar7->nmps)[uVar12 < uVar25];
            uVar25 = uVar12;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_00131ab4;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_00131ab4:
              uVar25 = uVar25 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar25 < 0x8000);
          }
        }
        poVar7 = *ppoVar5;
        uVar18 = poVar7->qeval;
        uVar12 = uVar25 - uVar18;
        if (OVar24 >> 0x10 < uVar18) {
          uVar32 = (uint)(poVar7->mps == 0);
          if (uVar18 > uVar12) {
            uVar32 = poVar7->mps;
          }
          *ppoVar5 = (&poVar7->nmps)[uVar18 <= uVar12];
          uVar12 = uVar18;
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_00131d16;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_00131d16:
            uVar12 = uVar12 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar12 < 0x8000);
        }
        else {
          OVar24 = OVar24 + uVar18 * -0x10000;
          if ((short)uVar12 < 0) {
            uVar32 = poVar7->mps;
          }
          else {
            uVar32 = (uint)(poVar7->mps == 0);
            if (uVar12 >= uVar18) {
              uVar32 = poVar7->mps;
            }
            *ppoVar5 = (&poVar7->nmps)[uVar12 < uVar18];
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_00131db0;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_00131db0:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
        }
        uVar32 = OVar26 * 2 | uVar32;
        uVar30 = 0;
        uVar25 = 0;
        ppoVar15 = ppoVar5;
        switch(uVar32) {
        case 0:
          goto switchD_00131dfb_caseD_0;
        case 1:
          goto switchD_00131dfb_caseD_1;
        case 2:
          bVar34 = false;
          goto LAB_00132dbd;
        case 3:
          bVar34 = false;
          goto LAB_0013310f;
        default:
          goto switchD_00131dfb_default;
        }
      }
      uVar25 = 0;
      ppoVar15 = ppoVar4;
      goto switchD_00131dfb_default;
    }
    uVar27 = 0;
LAB_0012be7a:
    iVar33 = 0;
LAB_0012be82:
    puVar23 = puVar14;
    puVar11 = puVar10;
    uVar25 = *puVar11;
    uVar30 = (ulong)uVar25;
    if (uVar30 != 0) {
      if ((uVar25 & 0x200010) == 0) {
        bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
        ppoVar15 = (t1->mqc).ctxs + bVar6;
        poVar7 = (t1->mqc).ctxs[bVar6];
        uVar20 = poVar7->qeval;
        uVar12 = uVar12 - uVar20;
        if (OVar24 >> 0x10 < uVar20) {
          uVar18 = (uint)(poVar7->mps == 0);
          if (uVar20 > uVar12) {
            uVar18 = poVar7->mps;
          }
          *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
          uVar12 = uVar20;
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_0012bf37;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_0012bf37:
            uVar12 = uVar12 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar12 < 0x8000);
        }
        else {
          OVar24 = OVar24 + uVar20 * -0x10000;
          if ((short)uVar12 < 0) {
            uVar18 = poVar7->mps;
          }
          else {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar12 >= uVar20) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0012c0e9;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0012c0e9:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
        }
        if (uVar18 != 0) {
          uVar18 = uVar25 >> 0x10 & 0x40 | uVar25 & 0xaa | uVar25 >> 0xe & 0x10 |
                   puVar11[-1] >> 0x13 & 1 | puVar11[1] >> 0x11 & 4;
          ppoVar15 = (t1->mqc).ctxs +
                     "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                     [uVar18];
          poVar7 = *ppoVar15;
          uVar20 = poVar7->qeval;
          uVar12 = uVar12 - uVar20;
          if (OVar24 >> 0x10 < uVar20) {
            uVar32 = (uint)(poVar7->mps == 0);
            if (uVar20 > uVar12) {
              uVar32 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
            uVar12 = uVar20;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0012c336;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0012c336:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar20 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar32 = poVar7->mps;
            }
            else {
              uVar32 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar20) {
                uVar32 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_0012c3e0;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_0012c3e0:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          uVar19 = uVar32 ^ ""[uVar18];
          uVar20 = uVar17;
          if (uVar32 == ""[uVar18]) {
            uVar20 = uVar16;
          }
          *puVar23 = uVar20;
          *(byte *)(puVar11 + -1) = (byte)puVar11[-1] | 0x20;
          *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 8;
          puVar11[-0x42] = uVar19 << 0x1f | puVar11[-0x42] | 0x10000;
          *(byte *)((long)puVar11 + -0x10a) = *(byte *)((long)puVar11 + -0x10a) | 2;
          *(byte *)((long)puVar11 + -0x103) = *(byte *)((long)puVar11 + -0x103) | 0x80;
          uVar30 = (ulong)(uVar19 << 0x13 | uVar25 | 0x10);
        }
      }
      if ((uVar30 & 0x1000080) == 0) {
        uVar20 = (uint)(uVar30 >> 3);
        bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar20 & 0x1ef];
        ppoVar15 = (t1->mqc).ctxs + bVar6;
        poVar7 = (t1->mqc).ctxs[bVar6];
        uVar25 = poVar7->qeval;
        uVar12 = uVar12 - uVar25;
        if (OVar24 >> 0x10 < uVar25) {
          uVar18 = (uint)(poVar7->mps == 0);
          if (uVar25 > uVar12) {
            uVar18 = poVar7->mps;
          }
          *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
          uVar12 = uVar25;
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_0012c760;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_0012c760:
            uVar12 = uVar12 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar12 < 0x8000);
        }
        else {
          OVar24 = OVar24 + uVar25 * -0x10000;
          if ((short)uVar12 < 0) {
            uVar18 = poVar7->mps;
          }
          else {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar12 >= uVar25) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0012c7fa;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0012c7fa:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
        }
        if (uVar18 != 0) {
          uVar20 = (uint)(uVar30 >> 0x13) & 0x40 | uVar20 & 0xaa | (uint)(uVar30 >> 0xf) & 0x10 |
                   puVar11[-1] >> 0x16 & 1 | puVar11[1] >> 0x14 & 4;
          ppoVar15 = (t1->mqc).ctxs +
                     "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                     [uVar20];
          poVar7 = *ppoVar15;
          uVar25 = poVar7->qeval;
          uVar12 = uVar12 - uVar25;
          if (OVar24 >> 0x10 < uVar25) {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar25 > uVar12) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
            uVar12 = uVar25;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0012c8f4;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0012c8f4:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar25 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar18 = poVar7->mps;
            }
            else {
              uVar18 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar25) {
                uVar18 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_0012c999;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_0012c999:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          bVar6 = ""[uVar20];
          uVar25 = uVar17;
          if (uVar18 == bVar6) {
            uVar25 = uVar16;
          }
          puVar23[0x40] = uVar25;
          *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 1;
          uVar30 = (ulong)((uint)uVar30 | (uVar18 ^ bVar6) << 0x16 | 0x80);
          *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 0x40;
        }
      }
      if ((uVar30 & 0x8000400) == 0) {
        uVar20 = (uint)(uVar30 >> 6);
        bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar20 & 0x1ef];
        ppoVar15 = (t1->mqc).ctxs + bVar6;
        poVar7 = (t1->mqc).ctxs[bVar6];
        uVar25 = poVar7->qeval;
        uVar12 = uVar12 - uVar25;
        if (OVar24 >> 0x10 < uVar25) {
          uVar18 = (uint)(poVar7->mps == 0);
          if (uVar25 > uVar12) {
            uVar18 = poVar7->mps;
          }
          *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
          uVar12 = uVar25;
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_0012cab3;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_0012cab3:
            uVar12 = uVar12 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar12 < 0x8000);
        }
        else {
          OVar24 = OVar24 + uVar25 * -0x10000;
          if ((short)uVar12 < 0) {
            uVar18 = poVar7->mps;
          }
          else {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar12 >= uVar25) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0012cb48;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0012cb48:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
        }
        if (uVar18 != 0) {
          uVar20 = (uint)(uVar30 >> 0x16) & 0x40 | uVar20 & 0xaa | (uint)(uVar30 >> 0x12) & 0x10 |
                   puVar11[-1] >> 0x19 & 1 | puVar11[1] >> 0x17 & 4;
          ppoVar15 = (t1->mqc).ctxs +
                     "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                     [uVar20];
          poVar7 = *ppoVar15;
          uVar25 = poVar7->qeval;
          uVar12 = uVar12 - uVar25;
          if (OVar24 >> 0x10 < uVar25) {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar25 > uVar12) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
            uVar12 = uVar25;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0012cc3d;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0012cc3d:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar25 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar18 = poVar7->mps;
            }
            else {
              uVar18 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar25) {
                uVar18 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_0012cce7;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_0012cce7:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          bVar6 = ""[uVar20];
          uVar25 = uVar17;
          if (uVar18 == bVar6) {
            uVar25 = uVar16;
          }
          puVar23[0x80] = uVar25;
          *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 8;
          uVar30 = (ulong)((uint)uVar30 | (uVar18 ^ bVar6) << 0x19 | 0x400);
          *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 2;
        }
      }
      uVar25 = (uint)uVar30;
      if ((uVar30 & 0x40002000) == 0) {
        uVar18 = (uint)(uVar30 >> 9);
        bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar18 & 0x1ef];
        ppoVar15 = (t1->mqc).ctxs + bVar6;
        poVar7 = (t1->mqc).ctxs[bVar6];
        uVar20 = poVar7->qeval;
        uVar12 = uVar12 - uVar20;
        if (OVar24 >> 0x10 < uVar20) {
          uVar32 = (uint)(poVar7->mps == 0);
          if (uVar20 > uVar12) {
            uVar32 = poVar7->mps;
          }
          *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
          uVar12 = uVar20;
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_0012ce01;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_0012ce01:
            uVar12 = uVar12 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar12 < 0x8000);
        }
        else {
          OVar24 = OVar24 + uVar20 * -0x10000;
          if ((short)uVar12 < 0) {
            uVar32 = poVar7->mps;
          }
          else {
            uVar32 = (uint)(poVar7->mps == 0);
            if (uVar12 >= uVar20) {
              uVar32 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0012ce9b;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0012ce9b:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
        }
        if (uVar32 != 0) {
          uVar18 = (uint)(uVar30 >> 0x19) & 0x40 | uVar18 & 0xaa | (uint)(uVar30 >> 0x15) & 0x10 |
                   puVar11[-1] >> 0x1c & 1 | puVar11[1] >> 0x1a & 4;
          ppoVar15 = (t1->mqc).ctxs +
                     "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                     [uVar18];
          poVar7 = *ppoVar15;
          uVar20 = poVar7->qeval;
          uVar12 = uVar12 - uVar20;
          if (OVar24 >> 0x10 < uVar20) {
            uVar32 = (uint)(poVar7->mps == 0);
            if (uVar20 > uVar12) {
              uVar32 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
            uVar12 = uVar20;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0012cf9f;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0012cf9f:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar20 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar32 = poVar7->mps;
            }
            else {
              uVar32 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar20) {
                uVar32 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_0012d03f;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_0012d03f:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          uVar19 = uVar32 ^ ""[uVar18];
          uVar20 = uVar17;
          if (uVar32 == ""[uVar18]) {
            uVar20 = uVar16;
          }
          puVar23[0xc0] = uVar20;
          *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 0x40;
          *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 0x10;
          puVar11[0x42] = uVar19 << 0x12 | puVar11[0x42] | 2;
          *(byte *)(puVar11 + 0x41) = (byte)puVar11[0x41] | 4;
          uVar25 = uVar25 | uVar19 << 0x1c | 0x2000;
          *(byte *)(puVar11 + 0x43) = (byte)puVar11[0x43] | 1;
        }
      }
LAB_0012dbeb:
      *puVar11 = uVar25 & 0xb6dfffff;
      goto LAB_0012dbf6;
    }
    poVar7 = *ppoVar4;
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        OVar26 = poVar7->mps;
      }
      *ppoVar4 = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0012bfc8;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0012bfc8:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        OVar26 = poVar7->mps;
      }
      else {
        OVar26 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          OVar26 = poVar7->mps;
        }
        *ppoVar4 = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0012c052;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0012c052:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    if (OVar26 != 0) {
      poVar7 = *ppoVar5;
      uVar25 = poVar7->qeval;
      uVar12 = uVar12 - uVar25;
      if (OVar24 >> 0x10 < uVar25) {
        OVar31 = (uint)(poVar7->mps == 0);
        if (uVar25 > uVar12) {
          OVar31 = poVar7->mps;
        }
        *ppoVar5 = (&poVar7->nmps)[uVar25 <= uVar12];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0012c19c;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0012c19c:
          uVar25 = uVar25 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar25 < 0x8000);
      }
      else {
        OVar24 = OVar24 + uVar25 * -0x10000;
        if ((short)uVar12 < 0) {
          OVar31 = poVar7->mps;
          uVar25 = uVar12;
        }
        else {
          OVar31 = (uint)(poVar7->mps == 0);
          if (uVar12 >= uVar25) {
            OVar31 = poVar7->mps;
          }
          *ppoVar5 = (&poVar7->nmps)[uVar12 < uVar25];
          uVar25 = uVar12;
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_0012c233;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_0012c233:
            uVar25 = uVar25 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar25 < 0x8000);
        }
      }
      poVar7 = *ppoVar5;
      uVar20 = poVar7->qeval;
      uVar12 = uVar25 - uVar20;
      if (OVar24 >> 0x10 < uVar20) {
        uVar18 = (uint)(poVar7->mps == 0);
        if (uVar20 > uVar12) {
          uVar18 = poVar7->mps;
        }
        *ppoVar5 = (&poVar7->nmps)[uVar20 <= uVar12];
        uVar12 = uVar20;
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0012c482;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0012c482:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
      else {
        OVar24 = OVar24 + uVar20 * -0x10000;
        if ((short)uVar12 < 0) {
          uVar18 = poVar7->mps;
        }
        else {
          uVar18 = (uint)(poVar7->mps == 0);
          if (uVar12 >= uVar20) {
            uVar18 = poVar7->mps;
          }
          *ppoVar5 = (&poVar7->nmps)[uVar12 < uVar20];
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_0012c517;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_0012c517:
            uVar12 = uVar12 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar12 < 0x8000);
        }
      }
      uVar18 = OVar31 * 2 | uVar18;
      uVar30 = 0;
      uVar25 = 0;
      ppoVar15 = ppoVar5;
      switch(uVar18) {
      case 0:
        goto switchD_0012c563_caseD_0;
      case 1:
        goto switchD_0012c563_caseD_1;
      case 2:
        bVar34 = false;
        goto LAB_0012d52e;
      case 3:
        bVar34 = false;
        goto LAB_0012d86c;
      default:
        goto switchD_0012c563_default;
      }
    }
    uVar25 = 0;
    ppoVar15 = ppoVar4;
    goto switchD_0012c563_default;
  }
  flagsp = t1->flags + (uVar12 + 3);
  uVar25 = (uint)(1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
  puVar14 = (uint *)t1->data;
  ppoVar15 = (t1->mqc).curctx;
  uVar16 = (t1->mqc).c;
  uVar9 = (ulong)uVar16;
  uVar17 = (t1->mqc).a;
  OVar24 = (t1->mqc).ct;
  uVar27 = t1->h;
  if ((cblksty & 8U) == 0) {
    uVar20 = 0;
    if (3 < uVar27) {
      ppOVar1 = &(t1->mqc).bp;
      uVar32 = -uVar25;
      uVar18 = uVar12 * 3;
      ppoVar4 = (t1->mqc).ctxs + 0x11;
      ppoVar5 = (t1->mqc).ctxs + 0x12;
      uVar20 = 0;
      do {
        if (uVar30 != 0) {
          uVar16 = 0;
LAB_0012dd06:
          uVar27 = *flagsp;
          uVar13 = (ulong)uVar27;
          uVar19 = (uint)(uVar9 >> 0x10);
          if (uVar13 != 0) {
            if ((uVar27 & 0x200010) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar27 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar28 = poVar7->qeval;
              uVar17 = uVar17 - uVar28;
              if (uVar19 < uVar28) {
                uVar19 = (uint)(poVar7->mps == 0);
                if (uVar28 > uVar17) {
                  uVar19 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar28 <= uVar17];
                uVar17 = uVar28;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_0012ddb1;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_0012ddb1:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar28 * -0x10000);
                if ((short)uVar17 < 0) {
                  uVar19 = poVar7->mps;
                }
                else {
                  uVar19 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar28) {
                    uVar19 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar28];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0012df68;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0012df68:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (uVar19 != 0) {
                uVar28 = uVar27 >> 0x10 & 0x40 | uVar27 & 0xaa | uVar27 >> 0xe & 0x10 |
                         flagsp[-1] >> 0x13 & 1 | flagsp[1] >> 0x11 & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar28];
                poVar7 = *ppoVar15;
                uVar19 = poVar7->qeval;
                uVar17 = uVar17 - uVar19;
                if ((uint)(uVar9 >> 0x10) < uVar19) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar19 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
                  uVar17 = uVar19;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0012e19c;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0012e19c:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar19) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_0012e228;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0012e228:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                uVar21 = OVar29 ^ ""[uVar28];
                uVar19 = uVar32;
                if (OVar29 == ""[uVar28]) {
                  uVar19 = uVar25;
                }
                *puVar14 = uVar19;
                *(byte *)(flagsp + -1) = (byte)flagsp[-1] | 0x20;
                *(byte *)(flagsp + 1) = (byte)flagsp[1] | 8;
                uVar13 = (ulong)(t1->w + 2);
                puVar10 = flagsp + -uVar13;
                *puVar10 = uVar21 << 0x1f | *puVar10 | 0x10000;
                pbVar3 = (byte *)((long)flagsp + uVar13 * -4 + -2);
                *pbVar3 = *pbVar3 | 2;
                *(byte *)((long)puVar10 + 5) = *(byte *)((long)puVar10 + 5) | 0x80;
                uVar13 = (ulong)(uVar21 << 0x13 | uVar27 | 0x10);
              }
            }
            if ((uVar13 & 0x1000080) == 0) {
              uVar19 = (uint)(uVar13 >> 3);
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar19 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar27 = poVar7->qeval;
              uVar17 = uVar17 - uVar27;
              if ((uint)(uVar9 >> 0x10) < uVar27) {
                OVar29 = (uint)(poVar7->mps == 0);
                if (uVar27 > uVar17) {
                  OVar29 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                uVar17 = uVar27;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_0012e579;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_0012e579:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                if ((short)uVar17 < 0) {
                  OVar29 = poVar7->mps;
                }
                else {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar27) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0012e601;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0012e601:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (OVar29 != 0) {
                uVar19 = (uint)(uVar13 >> 0x13) & 0x40 | uVar19 & 0xaa |
                         (uint)(uVar13 >> 0xf) & 0x10 | flagsp[-1] >> 0x16 & 1 |
                         flagsp[1] >> 0x14 & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar7 = *ppoVar15;
                uVar27 = poVar7->qeval;
                uVar17 = uVar17 - uVar27;
                if ((uint)(uVar9 >> 0x10) < uVar27) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar27 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                  uVar17 = uVar27;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0012e6ef;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0012e6ef:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar27) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_0012e778;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0012e778:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                bVar6 = ""[uVar19];
                uVar27 = uVar32;
                if (OVar29 == bVar6) {
                  uVar27 = uVar25;
                }
                puVar14[uVar30] = uVar27;
                *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 1;
                uVar13 = (ulong)((uint)uVar13 | (OVar29 ^ bVar6) << 0x16 | 0x80);
                *(byte *)(flagsp + 1) = (byte)flagsp[1] | 0x40;
              }
            }
            if ((uVar13 & 0x8000400) == 0) {
              uVar19 = (uint)(uVar13 >> 6);
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar19 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar27 = poVar7->qeval;
              uVar17 = uVar17 - uVar27;
              if ((uint)(uVar9 >> 0x10) < uVar27) {
                OVar29 = (uint)(poVar7->mps == 0);
                if (uVar27 > uVar17) {
                  OVar29 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                uVar17 = uVar27;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_0012e885;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_0012e885:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                if ((short)uVar17 < 0) {
                  OVar29 = poVar7->mps;
                }
                else {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar27) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0012e90d;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0012e90d:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (OVar29 != 0) {
                uVar19 = (uint)(uVar13 >> 0x16) & 0x40 | uVar19 & 0xaa |
                         (uint)(uVar13 >> 0x12) & 0x10 | flagsp[-1] >> 0x19 & 1 |
                         flagsp[1] >> 0x17 & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar7 = *ppoVar15;
                uVar27 = poVar7->qeval;
                uVar17 = uVar17 - uVar27;
                if ((uint)(uVar9 >> 0x10) < uVar27) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar27 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                  uVar17 = uVar27;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0012e9fb;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0012e9fb:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar27) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_0012ea84;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0012ea84:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                bVar6 = ""[uVar19];
                uVar27 = uVar32;
                if (OVar29 == bVar6) {
                  uVar27 = uVar25;
                }
                puVar14[uVar12 * 2] = uVar27;
                *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 8;
                uVar13 = (ulong)((uint)uVar13 | (OVar29 ^ bVar6) << 0x19 | 0x400);
                *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 2;
              }
            }
            uVar27 = (uint)uVar13;
            if ((uVar13 & 0x40002000) == 0) {
              uVar28 = (uint)(uVar13 >> 9);
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar28 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar19 = poVar7->qeval;
              uVar17 = uVar17 - uVar19;
              if ((uint)(uVar9 >> 0x10) < uVar19) {
                OVar29 = (uint)(poVar7->mps == 0);
                if (uVar19 > uVar17) {
                  OVar29 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
                uVar17 = uVar19;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_0012eb91;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_0012eb91:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
                if ((short)uVar17 < 0) {
                  OVar29 = poVar7->mps;
                }
                else {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar19) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0012ec17;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0012ec17:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (OVar29 != 0) {
                uVar28 = (uint)(uVar13 >> 0x19) & 0x40 | uVar28 & 0xaa |
                         (uint)(uVar13 >> 0x15) & 0x10 | flagsp[-1] >> 0x1c & 1 |
                         flagsp[1] >> 0x1a & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar28];
                poVar7 = *ppoVar15;
                uVar19 = poVar7->qeval;
                uVar17 = uVar17 - uVar19;
                if ((uint)(uVar9 >> 0x10) < uVar19) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar19 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
                  uVar17 = uVar19;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0012ed09;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0012ed09:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar19) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_0012ed9c;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0012ed9c:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                uVar21 = OVar29 ^ ""[uVar28];
                uVar19 = uVar32;
                if (OVar29 == ""[uVar28]) {
                  uVar19 = uVar25;
                }
                puVar14[uVar18] = uVar19;
                *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 0x40;
                *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 0x10;
                uVar13 = (ulong)(t1->w + 2);
                flagsp[uVar13] = uVar21 << 0x12 | flagsp[uVar13] | 2;
                *(byte *)(flagsp + (uVar13 - 1)) = (byte)flagsp[uVar13 - 1] | 4;
                uVar27 = uVar27 | uVar21 << 0x1c | 0x2000;
                *(byte *)(flagsp + uVar13 + 1) = (byte)flagsp[uVar13 + 1] | 1;
              }
            }
LAB_0012f896:
            *flagsp = uVar27 & 0xb6dfffff;
            goto LAB_0012f8a0;
          }
          poVar7 = *ppoVar4;
          uVar27 = poVar7->qeval;
          uVar17 = uVar17 - uVar27;
          if (uVar19 < uVar27) {
            OVar29 = (uint)(poVar7->mps == 0);
            if (uVar27 > uVar17) {
              OVar29 = poVar7->mps;
            }
            *ppoVar4 = (&poVar7->nmps)[uVar27 <= uVar17];
            uVar17 = uVar27;
            do {
              iVar33 = (int)uVar9;
              if (OVar24 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x200;
                    OVar24 = 7;
                    goto LAB_0012de42;
                  }
                  iVar33 = iVar33 + 0xff00;
                  pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  iVar33 = iVar33 + (uint)bVar6 * 0x100;
                }
                OVar24 = 8;
              }
LAB_0012de42:
              uVar17 = uVar17 * 2;
              uVar9 = (ulong)(uint)(iVar33 * 2);
              OVar24 = OVar24 - 1;
            } while (uVar17 < 0x8000);
          }
          else {
            uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
            if ((short)uVar17 < 0) {
              OVar29 = poVar7->mps;
            }
            else {
              OVar29 = (uint)(poVar7->mps == 0);
              if (uVar17 >= uVar27) {
                OVar29 = poVar7->mps;
              }
              *ppoVar4 = (&poVar7->nmps)[uVar17 < uVar27];
              do {
                iVar33 = (int)uVar9;
                if (OVar24 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x200;
                      OVar24 = 7;
                      goto LAB_0012ded1;
                    }
                    iVar33 = iVar33 + 0xff00;
                    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x100;
                  }
                  OVar24 = 8;
                }
LAB_0012ded1:
                uVar17 = uVar17 * 2;
                uVar9 = (ulong)(uint)(iVar33 * 2);
                OVar24 = OVar24 - 1;
              } while (uVar17 < 0x8000);
            }
          }
          if (OVar29 != 0) {
            poVar7 = *ppoVar5;
            uVar27 = poVar7->qeval;
            uVar17 = uVar17 - uVar27;
            if ((uint)(uVar9 >> 0x10) < uVar27) {
              uVar19 = (uint)(poVar7->mps == 0);
              if (uVar27 > uVar17) {
                uVar19 = poVar7->mps;
              }
              *ppoVar5 = (&poVar7->nmps)[uVar27 <= uVar17];
              do {
                iVar33 = (int)uVar9;
                if (OVar24 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x200;
                      OVar24 = 7;
                      goto LAB_0012e011;
                    }
                    iVar33 = iVar33 + 0xff00;
                    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x100;
                  }
                  OVar24 = 8;
                }
LAB_0012e011:
                uVar27 = uVar27 * 2;
                uVar9 = (ulong)(uint)(iVar33 * 2);
                OVar24 = OVar24 - 1;
              } while (uVar27 < 0x8000);
            }
            else {
              uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
              if ((short)uVar17 < 0) {
                uVar19 = poVar7->mps;
                uVar27 = uVar17;
              }
              else {
                uVar19 = (uint)(poVar7->mps == 0);
                if (uVar17 >= uVar27) {
                  uVar19 = poVar7->mps;
                }
                *ppoVar5 = (&poVar7->nmps)[uVar17 < uVar27];
                uVar27 = uVar17;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_0012e0a7;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_0012e0a7:
                  uVar27 = uVar27 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar27 < 0x8000);
              }
            }
            poVar7 = *ppoVar5;
            uVar28 = poVar7->qeval;
            uVar17 = uVar27 - uVar28;
            if ((uint)(uVar9 >> 0x10) < uVar28) {
              OVar26 = (uint)(poVar7->mps == 0);
              if (uVar28 > uVar17) {
                OVar26 = poVar7->mps;
              }
              *ppoVar5 = (&poVar7->nmps)[uVar28 <= uVar17];
              uVar17 = uVar28;
              do {
                iVar33 = (int)uVar9;
                if (OVar24 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x200;
                      OVar24 = 7;
                      goto LAB_0012e2c2;
                    }
                    iVar33 = iVar33 + 0xff00;
                    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x100;
                  }
                  OVar24 = 8;
                }
LAB_0012e2c2:
                uVar17 = uVar17 * 2;
                uVar9 = (ulong)(uint)(iVar33 * 2);
                OVar24 = OVar24 - 1;
              } while (uVar17 < 0x8000);
            }
            else {
              uVar9 = (ulong)((int)uVar9 + uVar28 * -0x10000);
              if ((short)uVar17 < 0) {
                OVar26 = poVar7->mps;
              }
              else {
                OVar26 = (uint)(poVar7->mps == 0);
                if (uVar17 >= uVar28) {
                  OVar26 = poVar7->mps;
                }
                *ppoVar5 = (&poVar7->nmps)[uVar17 < uVar28];
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_0012e349;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_0012e349:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
            }
            uVar19 = uVar19 * 2 | OVar26;
            uVar13 = 0;
            uVar27 = 0;
            ppoVar15 = ppoVar5;
            switch(uVar19) {
            case 0:
              goto switchD_0012e392_caseD_0;
            case 1:
              goto switchD_0012e392_caseD_1;
            case 2:
              bVar34 = false;
              goto LAB_0012f250;
            case 3:
              bVar34 = false;
              goto LAB_0012f559;
            default:
              goto switchD_0012e392_default;
            }
          }
          uVar27 = 0;
          ppoVar15 = ppoVar4;
          goto switchD_0012e392_default;
        }
LAB_0012f8bd:
        uVar16 = (uint)uVar9;
        uVar20 = uVar20 + 4;
        puVar14 = puVar14 + uVar18;
        flagsp = flagsp + 2;
        uVar27 = t1->h;
      } while (uVar20 < (uVar27 & 0xfffffffc));
    }
    (t1->mqc).curctx = ppoVar15;
    (t1->mqc).c = uVar16;
    (t1->mqc).a = uVar17;
    (t1->mqc).ct = OVar24;
    if (uVar30 != 0 && uVar20 < uVar27) {
      uVar16 = 0;
      do {
        if (t1->h != uVar20) {
          uVar17 = 0;
          uVar30 = 0;
          do {
            opj_t1_dec_clnpass_step
                      (t1,flagsp,(OPJ_INT32 *)(puVar14 + uVar17),uVar25,(OPJ_UINT32)uVar30,0);
            uVar30 = uVar30 + 1;
            uVar17 = uVar17 + uVar12;
          } while (uVar30 < t1->h - uVar20);
        }
        *flagsp = *flagsp & 0xb6dfffff;
        uVar16 = uVar16 + 1;
        flagsp = flagsp + 1;
        puVar14 = puVar14 + 1;
      } while (uVar16 != uVar12);
    }
  }
  else {
    uVar20 = 0;
    if (3 < uVar27) {
      ppOVar1 = &(t1->mqc).bp;
      uVar32 = -uVar25;
      uVar18 = uVar12 * 3;
      ppoVar4 = (t1->mqc).ctxs + 0x11;
      ppoVar5 = (t1->mqc).ctxs + 0x12;
      uVar20 = 0;
      do {
        if (uVar30 != 0) {
          uVar16 = 0;
LAB_0012fa0b:
          uVar27 = *flagsp;
          uVar13 = (ulong)uVar27;
          uVar19 = (uint)(uVar9 >> 0x10);
          if (uVar13 != 0) {
            if ((uVar27 & 0x200010) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar27 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar28 = poVar7->qeval;
              uVar17 = uVar17 - uVar28;
              if (uVar19 < uVar28) {
                uVar19 = (uint)(poVar7->mps == 0);
                if (uVar28 > uVar17) {
                  uVar19 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar28 <= uVar17];
                uVar17 = uVar28;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_0012fab6;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_0012fab6:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar28 * -0x10000);
                if ((short)uVar17 < 0) {
                  uVar19 = poVar7->mps;
                }
                else {
                  uVar19 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar28) {
                    uVar19 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar28];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0012fc61;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0012fc61:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (uVar19 != 0) {
                uVar28 = uVar27 >> 0x10 & 0x40 | uVar27 & 0xaa | uVar27 >> 0xe & 0x10 |
                         flagsp[-1] >> 0x13 & 1 | flagsp[1] >> 0x11 & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar28];
                poVar7 = *ppoVar15;
                uVar19 = poVar7->qeval;
                uVar17 = uVar17 - uVar19;
                if ((uint)(uVar9 >> 0x10) < uVar19) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar19 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
                  uVar17 = uVar19;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0012fe95;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0012fe95:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar19) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_0012ff21;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0012ff21:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                bVar6 = ""[uVar28];
                uVar19 = uVar32;
                if (OVar29 == bVar6) {
                  uVar19 = uVar25;
                }
                *puVar14 = uVar19;
                *(byte *)(flagsp + -1) = (byte)flagsp[-1] | 0x20;
                *(byte *)(flagsp + 1) = (byte)flagsp[1] | 8;
                uVar13 = (ulong)((OVar29 ^ bVar6) << 0x13 | uVar27 | 0x10);
              }
            }
            if ((uVar13 & 0x1000080) == 0) {
              uVar19 = (uint)(uVar13 >> 3);
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar19 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar27 = poVar7->qeval;
              uVar17 = uVar17 - uVar27;
              if ((uint)(uVar9 >> 0x10) < uVar27) {
                OVar29 = (uint)(poVar7->mps == 0);
                if (uVar27 > uVar17) {
                  OVar29 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                uVar17 = uVar27;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_0013025b;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_0013025b:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                if ((short)uVar17 < 0) {
                  OVar29 = poVar7->mps;
                }
                else {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar27) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_001302e3;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_001302e3:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (OVar29 != 0) {
                uVar19 = (uint)(uVar13 >> 0x13) & 0x40 | uVar19 & 0xaa |
                         (uint)(uVar13 >> 0xf) & 0x10 | flagsp[-1] >> 0x16 & 1 |
                         flagsp[1] >> 0x14 & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar7 = *ppoVar15;
                uVar27 = poVar7->qeval;
                uVar17 = uVar17 - uVar27;
                if ((uint)(uVar9 >> 0x10) < uVar27) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar27 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                  uVar17 = uVar27;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_001303d1;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_001303d1:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar27) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013045a;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013045a:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                bVar6 = ""[uVar19];
                uVar27 = uVar32;
                if (OVar29 == bVar6) {
                  uVar27 = uVar25;
                }
                puVar14[uVar30] = uVar27;
                *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 1;
                uVar13 = (ulong)((uint)uVar13 | (OVar29 ^ bVar6) << 0x16 | 0x80);
                *(byte *)(flagsp + 1) = (byte)flagsp[1] | 0x40;
              }
            }
            if ((uVar13 & 0x8000400) == 0) {
              uVar19 = (uint)(uVar13 >> 6);
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar19 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar27 = poVar7->qeval;
              uVar17 = uVar17 - uVar27;
              if ((uint)(uVar9 >> 0x10) < uVar27) {
                OVar29 = (uint)(poVar7->mps == 0);
                if (uVar27 > uVar17) {
                  OVar29 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                uVar17 = uVar27;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_00130566;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_00130566:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                if ((short)uVar17 < 0) {
                  OVar29 = poVar7->mps;
                }
                else {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar27) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_001305ee;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_001305ee:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (OVar29 != 0) {
                uVar19 = (uint)(uVar13 >> 0x16) & 0x40 | uVar19 & 0xaa |
                         (uint)(uVar13 >> 0x12) & 0x10 | flagsp[-1] >> 0x19 & 1 |
                         flagsp[1] >> 0x17 & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar7 = *ppoVar15;
                uVar27 = poVar7->qeval;
                uVar17 = uVar17 - uVar27;
                if ((uint)(uVar9 >> 0x10) < uVar27) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar27 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                  uVar17 = uVar27;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_001306dc;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_001306dc:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar27) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_00130765;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_00130765:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                bVar6 = ""[uVar19];
                uVar27 = uVar32;
                if (OVar29 == bVar6) {
                  uVar27 = uVar25;
                }
                puVar14[uVar12 * 2] = uVar27;
                *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 8;
                uVar13 = (ulong)((uint)uVar13 | (OVar29 ^ bVar6) << 0x19 | 0x400);
                *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 2;
              }
            }
            uVar27 = (uint)uVar13;
            if ((uVar13 & 0x40002000) == 0) {
              uVar28 = (uint)(uVar13 >> 9);
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar28 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar19 = poVar7->qeval;
              uVar17 = uVar17 - uVar19;
              if ((uint)(uVar9 >> 0x10) < uVar19) {
                OVar29 = (uint)(poVar7->mps == 0);
                if (uVar19 > uVar17) {
                  OVar29 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
                uVar17 = uVar19;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_00130871;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_00130871:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
                if ((short)uVar17 < 0) {
                  OVar29 = poVar7->mps;
                }
                else {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar19) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_001308f7;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_001308f7:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (OVar29 != 0) {
                uVar28 = (uint)(uVar13 >> 0x19) & 0x40 | uVar28 & 0xaa |
                         (uint)(uVar13 >> 0x15) & 0x10 | flagsp[-1] >> 0x1c & 1 |
                         flagsp[1] >> 0x1a & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar28];
                poVar7 = *ppoVar15;
                uVar19 = poVar7->qeval;
                uVar17 = uVar17 - uVar19;
                if ((uint)(uVar9 >> 0x10) < uVar19) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar19 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
                  uVar17 = uVar19;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_001309e9;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_001309e9:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar19) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_00130a7c;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_00130a7c:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                uVar21 = OVar29 ^ ""[uVar28];
                uVar19 = uVar32;
                if (OVar29 == ""[uVar28]) {
                  uVar19 = uVar25;
                }
                puVar14[uVar18] = uVar19;
                *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 0x40;
                *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 0x10;
                uVar13 = (ulong)(t1->w + 2);
                flagsp[uVar13] = uVar21 << 0x12 | flagsp[uVar13] | 2;
                *(byte *)(flagsp + (uVar13 - 1)) = (byte)flagsp[uVar13 - 1] | 4;
                uVar27 = uVar27 | uVar21 << 0x1c | 0x2000;
                *(byte *)(flagsp + uVar13 + 1) = (byte)flagsp[uVar13 + 1] | 1;
              }
            }
LAB_001315ad:
            *flagsp = uVar27 & 0xb6dfffff;
            goto LAB_001315b7;
          }
          poVar7 = *ppoVar4;
          uVar27 = poVar7->qeval;
          uVar17 = uVar17 - uVar27;
          if (uVar19 < uVar27) {
            uVar19 = (uint)(poVar7->mps == 0);
            if (uVar27 > uVar17) {
              uVar19 = poVar7->mps;
            }
            *ppoVar4 = (&poVar7->nmps)[uVar27 <= uVar17];
            uVar17 = uVar27;
            do {
              iVar33 = (int)uVar9;
              if (OVar24 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x200;
                    OVar24 = 7;
                    goto LAB_0012fb44;
                  }
                  iVar33 = iVar33 + 0xff00;
                  pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  iVar33 = iVar33 + (uint)bVar6 * 0x100;
                }
                OVar24 = 8;
              }
LAB_0012fb44:
              uVar17 = uVar17 * 2;
              uVar9 = (ulong)(uint)(iVar33 * 2);
              OVar24 = OVar24 - 1;
            } while (uVar17 < 0x8000);
          }
          else {
            uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
            if ((short)uVar17 < 0) {
              uVar19 = poVar7->mps;
            }
            else {
              uVar19 = (uint)(poVar7->mps == 0);
              if (uVar17 >= uVar27) {
                uVar19 = poVar7->mps;
              }
              *ppoVar4 = (&poVar7->nmps)[uVar17 < uVar27];
              do {
                iVar33 = (int)uVar9;
                if (OVar24 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x200;
                      OVar24 = 7;
                      goto LAB_0012fbcd;
                    }
                    iVar33 = iVar33 + 0xff00;
                    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x100;
                  }
                  OVar24 = 8;
                }
LAB_0012fbcd:
                uVar17 = uVar17 * 2;
                uVar9 = (ulong)(uint)(iVar33 * 2);
                OVar24 = OVar24 - 1;
              } while (uVar17 < 0x8000);
            }
          }
          if (uVar19 != 0) {
            poVar7 = *ppoVar5;
            uVar27 = poVar7->qeval;
            uVar17 = uVar17 - uVar27;
            if ((uint)(uVar9 >> 0x10) < uVar27) {
              uVar28 = (uint)(poVar7->mps == 0);
              if (uVar27 > uVar17) {
                uVar28 = poVar7->mps;
              }
              *ppoVar5 = (&poVar7->nmps)[uVar27 <= uVar17];
              do {
                iVar33 = (int)uVar9;
                if (OVar24 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x200;
                      OVar24 = 7;
                      goto LAB_0012fd08;
                    }
                    iVar33 = iVar33 + 0xff00;
                    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x100;
                  }
                  OVar24 = 8;
                }
LAB_0012fd08:
                uVar27 = uVar27 * 2;
                uVar9 = (ulong)(uint)(iVar33 * 2);
                OVar24 = OVar24 - 1;
              } while (uVar27 < 0x8000);
            }
            else {
              uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
              if ((short)uVar17 < 0) {
                uVar28 = poVar7->mps;
                uVar27 = uVar17;
              }
              else {
                uVar28 = (uint)(poVar7->mps == 0);
                if (uVar17 >= uVar27) {
                  uVar28 = poVar7->mps;
                }
                *ppoVar5 = (&poVar7->nmps)[uVar17 < uVar27];
                uVar27 = uVar17;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_0012fda0;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_0012fda0:
                  uVar27 = uVar27 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar27 < 0x8000);
              }
            }
            poVar7 = *ppoVar5;
            uVar21 = poVar7->qeval;
            uVar17 = uVar27 - uVar21;
            if ((uint)(uVar9 >> 0x10) < uVar21) {
              OVar29 = (uint)(poVar7->mps == 0);
              if (uVar21 > uVar17) {
                OVar29 = poVar7->mps;
              }
              *ppoVar5 = (&poVar7->nmps)[uVar21 <= uVar17];
              uVar17 = uVar21;
              do {
                iVar33 = (int)uVar9;
                if (OVar24 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x200;
                      OVar24 = 7;
                      goto LAB_0012ffc2;
                    }
                    iVar33 = iVar33 + 0xff00;
                    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x100;
                  }
                  OVar24 = 8;
                }
LAB_0012ffc2:
                uVar17 = uVar17 * 2;
                uVar9 = (ulong)(uint)(iVar33 * 2);
                OVar24 = OVar24 - 1;
              } while (uVar17 < 0x8000);
            }
            else {
              uVar9 = (ulong)((int)uVar9 + uVar21 * -0x10000);
              if ((short)uVar17 < 0) {
                OVar29 = poVar7->mps;
              }
              else {
                OVar29 = (uint)(poVar7->mps == 0);
                if (uVar17 >= uVar21) {
                  OVar29 = poVar7->mps;
                }
                *ppoVar5 = (&poVar7->nmps)[uVar17 < uVar21];
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_00130056;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_00130056:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
            }
            uVar28 = uVar28 * 2 | OVar29;
            uVar13 = 0;
            uVar27 = 0;
            ppoVar15 = ppoVar5;
            switch(uVar28) {
            case 0:
              goto switchD_001300a3_caseD_0;
            case 1:
              goto switchD_001300a3_caseD_1;
            case 2:
              bVar34 = false;
              goto LAB_00130f29;
            case 3:
              bVar34 = false;
              goto LAB_0013125a;
            default:
              goto switchD_001300a3_default;
            }
          }
          uVar27 = 0;
          ppoVar15 = ppoVar4;
          goto switchD_001300a3_default;
        }
LAB_001315de:
        uVar16 = (uint)uVar9;
        uVar20 = uVar20 + 4;
        puVar14 = puVar14 + uVar18;
        flagsp = flagsp + 2;
        uVar27 = t1->h;
      } while (uVar20 < (uVar27 & 0xfffffffc));
    }
    (t1->mqc).curctx = ppoVar15;
    (t1->mqc).c = uVar16;
    (t1->mqc).a = uVar17;
    (t1->mqc).ct = OVar24;
    if (uVar30 != 0 && uVar20 < uVar27) {
      uVar16 = 0;
      do {
        if (t1->h != uVar20) {
          uVar17 = 0;
          uVar30 = 0;
          do {
            opj_t1_dec_clnpass_step
                      (t1,flagsp,(OPJ_INT32 *)(puVar14 + uVar17),uVar25,(OPJ_UINT32)uVar30,1);
            uVar30 = uVar30 + 1;
            uVar17 = uVar17 + uVar12;
          } while (uVar30 < t1->h - uVar20);
        }
        *flagsp = *flagsp & 0xb6dfffff;
        uVar16 = uVar16 + 1;
        flagsp = flagsp + 1;
        puVar14 = puVar14 + 1;
      } while (uVar16 != uVar12);
    }
  }
LAB_00133514:
  if ((cblksty & 0x20U) != 0) {
    (t1->mqc).curctx = (t1->mqc).ctxs + 0x12;
    poVar7 = (t1->mqc).ctxs[0x12];
    uVar12 = poVar7->qeval;
    uVar16 = (t1->mqc).c;
    uVar17 = (t1->mqc).a - uVar12;
    (t1->mqc).a = uVar17;
    if (uVar16 >> 0x10 < uVar12) {
      (t1->mqc).a = uVar12;
      (t1->mqc).ctxs[0x12] = (&poVar7->nmps)[uVar12 <= uVar17];
      OVar24 = (t1->mqc).ct;
      do {
        if (OVar24 == 0) {
          pOVar8 = (t1->mqc).bp;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              (t1->mqc).bp = pOVar8 + 1;
              uVar16 = uVar16 + (uint)bVar6 * 0x200;
              (t1->mqc).c = uVar16;
              (t1->mqc).ct = 7;
              OVar24 = 7;
              goto LAB_001335d0;
            }
            uVar16 = uVar16 + 0xff00;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar8 + 1;
            uVar16 = uVar16 + (uint)bVar6 * 0x100;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
          }
          OVar24 = 8;
        }
LAB_001335d0:
        uVar12 = uVar12 * 2;
        (t1->mqc).a = uVar12;
        uVar16 = uVar16 * 2;
        (t1->mqc).c = uVar16;
        OVar24 = OVar24 - 1;
        (t1->mqc).ct = OVar24;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = uVar16 + uVar12 * -0x10000;
      (t1->mqc).c = OVar24;
      if (-1 < (short)uVar17) {
        (t1->mqc).ctxs[0x12] = (&poVar7->nmps)[uVar17 < uVar12];
        OVar29 = (t1->mqc).ct;
        do {
          if (OVar29 == 0) {
            pOVar8 = (t1->mqc).bp;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                (t1->mqc).bp = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                (t1->mqc).c = OVar24;
                (t1->mqc).ct = 7;
                OVar29 = 7;
                goto LAB_0013368d;
              }
              OVar24 = OVar24 + 0xff00;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
            }
            OVar29 = 8;
          }
LAB_0013368d:
          uVar17 = uVar17 * 2;
          (t1->mqc).a = uVar17;
          OVar24 = OVar24 * 2;
          (t1->mqc).c = OVar24;
          OVar29 = OVar29 - 1;
          (t1->mqc).ct = OVar29;
        } while (uVar17 < 0x8000);
      }
    }
    poVar7 = (t1->mqc).ctxs[0x12];
    uVar12 = poVar7->qeval;
    uVar16 = (t1->mqc).c;
    uVar17 = (t1->mqc).a - uVar12;
    (t1->mqc).a = uVar17;
    if (uVar16 >> 0x10 < uVar12) {
      (t1->mqc).a = uVar12;
      (t1->mqc).ctxs[0x12] = (&poVar7->nmps)[uVar12 <= uVar17];
      OVar24 = (t1->mqc).ct;
      do {
        if (OVar24 == 0) {
          pOVar8 = (t1->mqc).bp;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              (t1->mqc).bp = pOVar8 + 1;
              uVar16 = uVar16 + (uint)bVar6 * 0x200;
              (t1->mqc).c = uVar16;
              (t1->mqc).ct = 7;
              OVar24 = 7;
              goto LAB_0013375f;
            }
            uVar16 = uVar16 + 0xff00;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar8 + 1;
            uVar16 = uVar16 + (uint)bVar6 * 0x100;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
          }
          OVar24 = 8;
        }
LAB_0013375f:
        uVar12 = uVar12 * 2;
        (t1->mqc).a = uVar12;
        uVar16 = uVar16 * 2;
        (t1->mqc).c = uVar16;
        OVar24 = OVar24 - 1;
        (t1->mqc).ct = OVar24;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = uVar16 + uVar12 * -0x10000;
      (t1->mqc).c = OVar24;
      if (-1 < (short)uVar17) {
        (t1->mqc).ctxs[0x12] = (&poVar7->nmps)[uVar17 < uVar12];
        OVar29 = (t1->mqc).ct;
        do {
          if (OVar29 == 0) {
            pOVar8 = (t1->mqc).bp;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                (t1->mqc).bp = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                (t1->mqc).c = OVar24;
                (t1->mqc).ct = 7;
                OVar29 = 7;
                goto LAB_0013381c;
              }
              OVar24 = OVar24 + 0xff00;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
            }
            OVar29 = 8;
          }
LAB_0013381c:
          uVar17 = uVar17 * 2;
          (t1->mqc).a = uVar17;
          OVar24 = OVar24 * 2;
          (t1->mqc).c = OVar24;
          OVar29 = OVar29 - 1;
          (t1->mqc).ct = OVar29;
        } while (uVar17 < 0x8000);
      }
    }
    poVar7 = (t1->mqc).ctxs[0x12];
    uVar12 = poVar7->qeval;
    uVar16 = (t1->mqc).c;
    uVar17 = (t1->mqc).a - uVar12;
    (t1->mqc).a = uVar17;
    if (uVar16 >> 0x10 < uVar12) {
      (t1->mqc).a = uVar12;
      (t1->mqc).ctxs[0x12] = (&poVar7->nmps)[uVar12 <= uVar17];
      OVar24 = (t1->mqc).ct;
      do {
        if (OVar24 == 0) {
          pOVar8 = (t1->mqc).bp;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              (t1->mqc).bp = pOVar8 + 1;
              uVar16 = uVar16 + (uint)bVar6 * 0x200;
              (t1->mqc).c = uVar16;
              (t1->mqc).ct = 7;
              OVar24 = 7;
              goto LAB_001338ee;
            }
            uVar16 = uVar16 + 0xff00;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar8 + 1;
            uVar16 = uVar16 + (uint)bVar6 * 0x100;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
          }
          OVar24 = 8;
        }
LAB_001338ee:
        uVar12 = uVar12 * 2;
        (t1->mqc).a = uVar12;
        uVar16 = uVar16 * 2;
        (t1->mqc).c = uVar16;
        OVar24 = OVar24 - 1;
        (t1->mqc).ct = OVar24;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = uVar16 + uVar12 * -0x10000;
      (t1->mqc).c = OVar24;
      if (-1 < (short)uVar17) {
        (t1->mqc).ctxs[0x12] = (&poVar7->nmps)[uVar17 < uVar12];
        OVar29 = (t1->mqc).ct;
        do {
          if (OVar29 == 0) {
            pOVar8 = (t1->mqc).bp;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                (t1->mqc).bp = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                (t1->mqc).c = OVar24;
                (t1->mqc).ct = 7;
                OVar29 = 7;
                goto LAB_001339ab;
              }
              OVar24 = OVar24 + 0xff00;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
            }
            OVar29 = 8;
          }
LAB_001339ab:
          uVar17 = uVar17 * 2;
          (t1->mqc).a = uVar17;
          OVar24 = OVar24 * 2;
          (t1->mqc).c = OVar24;
          OVar29 = OVar29 - 1;
          (t1->mqc).ct = OVar29;
        } while (uVar17 < 0x8000);
      }
    }
    ppoVar15 = (t1->mqc).curctx;
    poVar7 = *ppoVar15;
    uVar12 = poVar7->qeval;
    uVar16 = (t1->mqc).c;
    uVar17 = (t1->mqc).a - uVar12;
    (t1->mqc).a = uVar17;
    if (uVar16 >> 0x10 < uVar12) {
      (t1->mqc).a = uVar12;
      *ppoVar15 = (&poVar7->nmps)[uVar12 <= uVar17];
      uVar12 = (t1->mqc).a;
      OVar24 = (t1->mqc).ct;
      do {
        if (OVar24 == 0) {
          pOVar8 = (t1->mqc).bp;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              (t1->mqc).bp = pOVar8 + 1;
              uVar16 = uVar16 + (uint)bVar6 * 0x200;
              (t1->mqc).c = uVar16;
              (t1->mqc).ct = 7;
              OVar24 = 7;
              goto LAB_00133a84;
            }
            uVar16 = uVar16 + 0xff00;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar8 + 1;
            uVar16 = uVar16 + (uint)bVar6 * 0x100;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
          }
          OVar24 = 8;
        }
LAB_00133a84:
        uVar12 = uVar12 * 2;
        (t1->mqc).a = uVar12;
        uVar16 = uVar16 * 2;
        (t1->mqc).c = uVar16;
        OVar24 = OVar24 - 1;
        (t1->mqc).ct = OVar24;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = uVar16 + uVar12 * -0x10000;
      (t1->mqc).c = OVar24;
      if (-1 < (short)uVar17) {
        *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar12];
        OVar29 = (t1->mqc).ct;
        do {
          if (OVar29 == 0) {
            pOVar8 = (t1->mqc).bp;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                (t1->mqc).bp = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                (t1->mqc).c = OVar24;
                (t1->mqc).ct = 7;
                OVar29 = 7;
                goto LAB_00133b40;
              }
              OVar24 = OVar24 + 0xff00;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
            }
            OVar29 = 8;
          }
LAB_00133b40:
          uVar17 = uVar17 * 2;
          (t1->mqc).a = uVar17;
          OVar24 = OVar24 * 2;
          (t1->mqc).c = OVar24;
          OVar29 = OVar29 - 1;
          (t1->mqc).ct = OVar29;
        } while (uVar17 < 0x8000);
      }
    }
  }
  return;
switchD_001300a3_caseD_0:
  uVar21 = flagsp[1] >> 0x11 & 4 | flagsp[-1] >> 0x13 & 1;
  bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
          [uVar21];
  poVar7 = (t1->mqc).ctxs[bVar6];
  uVar27 = poVar7->qeval;
  uVar17 = uVar17 - uVar27;
  if ((uint)(uVar9 >> 0x10) < uVar27) {
    OVar29 = (uint)(poVar7->mps == 0);
    if (uVar27 > uVar17) {
      OVar29 = poVar7->mps;
    }
    (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
    uVar17 = uVar27;
    do {
      iVar33 = (int)uVar9;
      if (OVar24 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x200;
            OVar24 = 7;
            goto LAB_00130146;
          }
          iVar33 = iVar33 + 0xff00;
          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          iVar33 = iVar33 + (uint)bVar6 * 0x100;
        }
        OVar24 = 8;
      }
LAB_00130146:
      uVar17 = uVar17 * 2;
      uVar9 = (ulong)(uint)(iVar33 * 2);
      OVar24 = OVar24 - 1;
    } while (uVar17 < 0x8000);
  }
  else {
    uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
    if ((short)uVar17 < 0) {
      OVar29 = poVar7->mps;
    }
    else {
      OVar29 = (uint)(poVar7->mps == 0);
      if (uVar17 >= uVar27) {
        OVar29 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_00130b8e;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_00130b8e:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
  }
  bVar6 = ""[uVar21];
  uVar27 = uVar32;
  if (OVar29 == bVar6) {
    uVar27 = uVar25;
  }
  *puVar14 = uVar27;
  *(byte *)(flagsp + -1) = (byte)flagsp[-1] | 0x20;
  uVar13 = (ulong)((OVar29 ^ bVar6) << 0x13 | 0x10);
  *(byte *)(flagsp + 1) = (byte)flagsp[1] | 8;
switchD_001300a3_caseD_1:
  if (uVar28 == 0) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 3) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      uVar28 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        uVar28 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_00130c86;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_00130c86:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        uVar28 = poVar7->mps;
      }
      else {
        uVar28 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          uVar28 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_00130d19;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_00130d19:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    if (uVar28 != 0) goto LAB_00130d4e;
    bVar34 = true;
  }
  else {
LAB_00130d4e:
    uVar28 = (uint)(uVar13 >> 0x13) & 0x40 | (uint)(uVar13 >> 3) & 0xaa |
             (uint)(uVar13 >> 0xf) & 0x10 | flagsp[-1] >> 0x16 & 1 | flagsp[1] >> 0x14 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar28];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      OVar29 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        OVar29 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_00130e16;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_00130e16:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        OVar29 = poVar7->mps;
      }
      else {
        OVar29 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          OVar29 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_00130eb4;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_00130eb4:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    bVar6 = ""[uVar28];
    uVar27 = uVar32;
    if (OVar29 == bVar6) {
      uVar27 = uVar25;
    }
    puVar14[uVar30] = uVar27;
    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 1;
    uVar13 = (ulong)((uint)uVar13 | (OVar29 ^ bVar6) << 0x16 | 0x80);
    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 0x40;
    bVar34 = true;
  }
LAB_00130f29:
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 6) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      uVar28 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        uVar28 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_00130fb7;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_00130fb7:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        uVar28 = poVar7->mps;
      }
      else {
        uVar28 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          uVar28 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_0013104a;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0013104a:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    if (uVar28 != 0) goto LAB_0013107f;
    bVar34 = true;
  }
  else {
LAB_0013107f:
    uVar28 = (uint)(uVar13 >> 0x16) & 0x40 | (uint)(uVar13 >> 6) & 0xaa |
             (uint)(uVar13 >> 0x12) & 0x10 | flagsp[-1] >> 0x19 & 1 | flagsp[1] >> 0x17 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar28];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      OVar29 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        OVar29 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_00131147;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_00131147:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        OVar29 = poVar7->mps;
      }
      else {
        OVar29 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          OVar29 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_001311e5;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_001311e5:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    bVar6 = ""[uVar28];
    uVar27 = uVar32;
    if (OVar29 == bVar6) {
      uVar27 = uVar25;
    }
    puVar14[uVar12 * 2] = uVar27;
    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 8;
    uVar13 = (ulong)((uint)uVar13 | (OVar29 ^ bVar6) << 0x19 | 0x400);
    *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 2;
    bVar34 = true;
  }
LAB_0013125a:
  uVar27 = (uint)uVar13;
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 9) & 0x1ef];
    ppoVar15 = (t1->mqc).ctxs + bVar6;
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar28 = poVar7->qeval;
    uVar17 = uVar17 - uVar28;
    if ((uint)(uVar9 >> 0x10) < uVar28) {
      OVar29 = (uint)(poVar7->mps == 0);
      if (uVar28 > uVar17) {
        OVar29 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar28 <= uVar17];
      uVar17 = uVar28;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_001312f1;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_001312f1:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar28 * -0x10000);
      if ((short)uVar17 < 0) {
        OVar29 = poVar7->mps;
      }
      else {
        OVar29 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar28) {
          OVar29 = poVar7->mps;
        }
        *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar28];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_0013137f;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0013137f:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    if (OVar29 == 0) goto switchD_001300a3_default;
  }
  uVar21 = (uint)(uVar13 >> 0x19) & 0x40 | (uint)(uVar13 >> 9) & 0xaa |
           (uint)(uVar13 >> 0x15) & 0x10 | flagsp[-1] >> 0x1c & 1 | flagsp[1] >> 0x1a & 4;
  ppoVar15 = (t1->mqc).ctxs +
             "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
             [uVar21];
  poVar7 = *ppoVar15;
  uVar28 = poVar7->qeval;
  uVar17 = uVar17 - uVar28;
  if ((uint)(uVar9 >> 0x10) < uVar28) {
    OVar29 = (uint)(poVar7->mps == 0);
    if (uVar28 > uVar17) {
      OVar29 = poVar7->mps;
    }
    *ppoVar15 = (&poVar7->nmps)[uVar28 <= uVar17];
    uVar17 = uVar28;
    do {
      iVar33 = (int)uVar9;
      if (OVar24 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x200;
            OVar24 = 7;
            goto LAB_00131481;
          }
          iVar33 = iVar33 + 0xff00;
          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          iVar33 = iVar33 + (uint)bVar6 * 0x100;
        }
        OVar24 = 8;
      }
LAB_00131481:
      uVar17 = uVar17 * 2;
      uVar9 = (ulong)(uint)(iVar33 * 2);
      OVar24 = OVar24 - 1;
    } while (uVar17 < 0x8000);
  }
  else {
    uVar9 = (ulong)((int)uVar9 + uVar28 * -0x10000);
    if ((short)uVar17 < 0) {
      OVar29 = poVar7->mps;
    }
    else {
      OVar29 = (uint)(poVar7->mps == 0);
      if (uVar17 >= uVar28) {
        OVar29 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar28];
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_00131512;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_00131512:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
  }
  uVar22 = OVar29 ^ ""[uVar21];
  uVar28 = uVar32;
  if (OVar29 == ""[uVar21]) {
    uVar28 = uVar25;
  }
  puVar14[uVar18] = uVar28;
  *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 0x40;
  *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 0x10;
  uVar13 = (ulong)(t1->w + 2);
  flagsp[uVar13] = uVar22 << 0x12 | flagsp[uVar13] | 2;
  *(byte *)(flagsp + (uVar13 - 1)) = (byte)flagsp[uVar13 - 1] | 4;
  uVar27 = uVar27 | uVar22 << 0x1c | 0x2000;
  *(byte *)(flagsp + uVar13 + 1) = (byte)flagsp[uVar13 + 1] | 1;
switchD_001300a3_default:
  if (uVar19 != 0) goto LAB_001315ad;
LAB_001315b7:
  uVar16 = uVar16 + 1;
  puVar14 = puVar14 + 1;
  flagsp = flagsp + 1;
  if (uVar16 == uVar12) goto LAB_001315de;
  goto LAB_0012fa0b;
switchD_0012e392_caseD_0:
  uVar28 = flagsp[1] >> 0x11 & 4 | flagsp[-1] >> 0x13 & 1;
  bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
          [uVar28];
  poVar7 = (t1->mqc).ctxs[bVar6];
  uVar27 = poVar7->qeval;
  uVar17 = uVar17 - uVar27;
  if ((uint)(uVar9 >> 0x10) < uVar27) {
    uVar21 = (uint)(poVar7->mps == 0);
    if (uVar27 > uVar17) {
      uVar21 = poVar7->mps;
    }
    (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
    uVar17 = uVar27;
    do {
      iVar33 = (int)uVar9;
      if (OVar24 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x200;
            OVar24 = 7;
            goto LAB_0012e430;
          }
          iVar33 = iVar33 + 0xff00;
          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          iVar33 = iVar33 + (uint)bVar6 * 0x100;
        }
        OVar24 = 8;
      }
LAB_0012e430:
      uVar17 = uVar17 * 2;
      uVar9 = (ulong)(uint)(iVar33 * 2);
      OVar24 = OVar24 - 1;
    } while (uVar17 < 0x8000);
  }
  else {
    uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
    if ((short)uVar17 < 0) {
      uVar21 = poVar7->mps;
    }
    else {
      uVar21 = (uint)(poVar7->mps == 0);
      if (uVar17 >= uVar27) {
        uVar21 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0012eeaf;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0012eeaf:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
  }
  uVar22 = uVar21 ^ ""[uVar28];
  uVar27 = uVar32;
  if (uVar21 == ""[uVar28]) {
    uVar27 = uVar25;
  }
  *puVar14 = uVar27;
  *(byte *)(flagsp + -1) = (byte)flagsp[-1] | 0x20;
  *(byte *)(flagsp + 1) = (byte)flagsp[1] | 8;
  uVar13 = (ulong)(t1->w + 2);
  puVar10 = flagsp + -uVar13;
  *puVar10 = uVar22 << 0x1f | *puVar10 | 0x10000;
  pbVar3 = (byte *)((long)flagsp + uVar13 * -4 + -2);
  *pbVar3 = *pbVar3 | 2;
  uVar13 = (ulong)(uVar22 << 0x13 | 0x10);
  *(byte *)((long)puVar10 + 5) = *(byte *)((long)puVar10 + 5) | 0x80;
switchD_0012e392_caseD_1:
  if (uVar19 == 0) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 3) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      uVar19 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        uVar19 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0012efd6;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0012efd6:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        uVar19 = poVar7->mps;
      }
      else {
        uVar19 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          uVar19 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_0012f05e;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0012f05e:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    if (uVar19 != 0) goto LAB_0012f08f;
  }
  else {
LAB_0012f08f:
    uVar19 = (uint)(uVar13 >> 0x13) & 0x40 | (uint)(uVar13 >> 3) & 0xaa |
             (uint)(uVar13 >> 0xf) & 0x10 | flagsp[-1] >> 0x16 & 1 | flagsp[1] >> 0x14 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar19];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        OVar26 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0012f14e;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0012f14e:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        OVar26 = poVar7->mps;
      }
      else {
        OVar26 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          OVar26 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_0012f1e3;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0012f1e3:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    bVar6 = ""[uVar19];
    uVar27 = uVar32;
    if (OVar26 == bVar6) {
      uVar27 = uVar25;
    }
    puVar14[uVar30] = uVar27;
    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 1;
    uVar13 = (ulong)((uint)uVar13 | (OVar26 ^ bVar6) << 0x16 | 0x80);
    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 0x40;
  }
  bVar34 = true;
LAB_0012f250:
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 6) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      uVar19 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        uVar19 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0012f2df;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0012f2df:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        uVar19 = poVar7->mps;
      }
      else {
        uVar19 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          uVar19 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_0012f367;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0012f367:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    if (uVar19 != 0) goto LAB_0012f398;
  }
  else {
LAB_0012f398:
    uVar19 = (uint)(uVar13 >> 0x16) & 0x40 | (uint)(uVar13 >> 6) & 0xaa |
             (uint)(uVar13 >> 0x12) & 0x10 | flagsp[-1] >> 0x19 & 1 | flagsp[1] >> 0x17 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar19];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        OVar26 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0012f457;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0012f457:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        OVar26 = poVar7->mps;
      }
      else {
        OVar26 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          OVar26 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_0012f4ec;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0012f4ec:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    bVar6 = ""[uVar19];
    uVar27 = uVar32;
    if (OVar26 == bVar6) {
      uVar27 = uVar25;
    }
    puVar14[uVar12 * 2] = uVar27;
    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 8;
    uVar13 = (ulong)((uint)uVar13 | (OVar26 ^ bVar6) << 0x19 | 0x400);
    *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 2;
  }
  bVar34 = true;
LAB_0012f559:
  uVar27 = (uint)uVar13;
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 9) & 0x1ef];
    ppoVar15 = (t1->mqc).ctxs + bVar6;
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar19 = poVar7->qeval;
    uVar17 = uVar17 - uVar19;
    if ((uint)(uVar9 >> 0x10) < uVar19) {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar19 > uVar17) {
        OVar26 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
      uVar17 = uVar19;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0012f5f0;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0012f5f0:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
      if ((short)uVar17 < 0) {
        OVar26 = poVar7->mps;
      }
      else {
        OVar26 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar19) {
          OVar26 = poVar7->mps;
        }
        *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_0012f676;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0012f676:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    if (OVar26 == 0) goto switchD_0012e392_default;
  }
  uVar28 = (uint)(uVar13 >> 0x19) & 0x40 | (uint)(uVar13 >> 9) & 0xaa |
           (uint)(uVar13 >> 0x15) & 0x10 | flagsp[-1] >> 0x1c & 1 | flagsp[1] >> 0x1a & 4;
  ppoVar15 = (t1->mqc).ctxs +
             "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
             [uVar28];
  poVar7 = *ppoVar15;
  uVar19 = poVar7->qeval;
  uVar17 = uVar17 - uVar19;
  if ((uint)(uVar9 >> 0x10) < uVar19) {
    OVar26 = (uint)(poVar7->mps == 0);
    if (uVar19 > uVar17) {
      OVar26 = poVar7->mps;
    }
    *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
    uVar17 = uVar19;
    do {
      iVar33 = (int)uVar9;
      if (OVar24 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x200;
            OVar24 = 7;
            goto LAB_0012f76d;
          }
          iVar33 = iVar33 + 0xff00;
          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          iVar33 = iVar33 + (uint)bVar6 * 0x100;
        }
        OVar24 = 8;
      }
LAB_0012f76d:
      uVar17 = uVar17 * 2;
      uVar9 = (ulong)(uint)(iVar33 * 2);
      OVar24 = OVar24 - 1;
    } while (uVar17 < 0x8000);
  }
  else {
    uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
    if ((short)uVar17 < 0) {
      OVar26 = poVar7->mps;
    }
    else {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar17 >= uVar19) {
        OVar26 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0012f7f6;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0012f7f6:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
  }
  uVar21 = OVar26 ^ ""[uVar28];
  uVar19 = uVar32;
  if (OVar26 == ""[uVar28]) {
    uVar19 = uVar25;
  }
  puVar14[uVar18] = uVar19;
  *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 0x40;
  *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 0x10;
  uVar13 = (ulong)(t1->w + 2);
  flagsp[uVar13] = uVar21 << 0x12 | flagsp[uVar13] | 2;
  *(byte *)(flagsp + (uVar13 - 1)) = (byte)flagsp[uVar13 - 1] | 4;
  uVar27 = uVar27 | uVar21 << 0x1c | 0x2000;
  *(byte *)(flagsp + uVar13 + 1) = (byte)flagsp[uVar13 + 1] | 1;
switchD_0012e392_default:
  if (OVar29 != 0) goto LAB_0012f896;
LAB_0012f8a0:
  uVar16 = uVar16 + 1;
  puVar14 = puVar14 + 1;
  flagsp = flagsp + 1;
  if (uVar16 == uVar12) goto LAB_0012f8bd;
  goto LAB_0012dd06;
switchD_00131dfb_caseD_0:
  uVar18 = puVar11[1] >> 0x11 & 4 | puVar11[-1] >> 0x13 & 1;
  bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
          [uVar18];
  poVar7 = (t1->mqc).ctxs[bVar6];
  uVar25 = poVar7->qeval;
  uVar12 = uVar12 - uVar25;
  if (OVar24 >> 0x10 < uVar25) {
    OVar26 = (uint)(poVar7->mps == 0);
    if (uVar25 > uVar12) {
      OVar26 = poVar7->mps;
    }
    (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
    uVar12 = uVar25;
    do {
      if (OVar29 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x200;
            OVar29 = 7;
            goto LAB_00131ea4;
          }
          OVar24 = OVar24 + 0xff00;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          OVar24 = OVar24 + (uint)bVar6 * 0x100;
        }
        OVar29 = 8;
      }
LAB_00131ea4:
      uVar12 = uVar12 * 2;
      OVar24 = OVar24 * 2;
      OVar29 = OVar29 - 1;
    } while (uVar12 < 0x8000);
  }
  else {
    OVar24 = OVar24 + uVar25 * -0x10000;
    if ((short)uVar12 < 0) {
      OVar26 = poVar7->mps;
    }
    else {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar12 >= uVar25) {
        OVar26 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_001329ff;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_001329ff:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
  }
  bVar6 = ""[uVar18];
  uVar25 = uVar17;
  if (OVar26 == bVar6) {
    uVar25 = uVar16;
  }
  *puVar23 = uVar25;
  *(byte *)(puVar11 + -1) = (byte)puVar11[-1] | 0x20;
  uVar30 = (ulong)((OVar26 ^ bVar6) << 0x13 | 0x10);
  *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 8;
switchD_00131dfb_caseD_1:
  if (uVar32 == 0) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar30 >> 3) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      uVar18 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        uVar18 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_00132b05;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_00132b05:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar18 = poVar7->mps;
      }
      else {
        uVar18 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          uVar18 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_00132b9d;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_00132b9d:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    if (uVar18 != 0) goto LAB_00132bd8;
    bVar34 = true;
  }
  else {
LAB_00132bd8:
    uVar18 = (uint)(uVar30 >> 0x13) & 0x40 | (uint)(uVar30 >> 3) & 0xaa |
             (uint)(uVar30 >> 0xf) & 0x10 | puVar11[-1] >> 0x16 & 1 | puVar11[1] >> 0x14 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar18];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        OVar26 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_00132ca7;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_00132ca7:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        OVar26 = poVar7->mps;
      }
      else {
        OVar26 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          OVar26 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_00132d48;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_00132d48:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    bVar6 = ""[uVar18];
    uVar25 = uVar17;
    if (OVar26 == bVar6) {
      uVar25 = uVar16;
    }
    puVar23[0x40] = uVar25;
    *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 1;
    uVar30 = (ulong)((uint)uVar30 | (OVar26 ^ bVar6) << 0x16 | 0x80);
    *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 0x40;
    bVar34 = true;
  }
LAB_00132dbd:
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar30 >> 6) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      uVar18 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        uVar18 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_00132e52;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_00132e52:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar18 = poVar7->mps;
      }
      else {
        uVar18 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          uVar18 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_00132ef4;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_00132ef4:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    if (uVar18 != 0) goto LAB_00132f2f;
    bVar34 = true;
  }
  else {
LAB_00132f2f:
    uVar18 = (uint)(uVar30 >> 0x16) & 0x40 | (uint)(uVar30 >> 6) & 0xaa |
             (uint)(uVar30 >> 0x12) & 0x10 | puVar11[-1] >> 0x19 & 1 | puVar11[1] >> 0x17 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar18];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        OVar26 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_00132ffe;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_00132ffe:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        OVar26 = poVar7->mps;
      }
      else {
        OVar26 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          OVar26 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0013309f;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0013309f:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    bVar6 = ""[uVar18];
    uVar25 = uVar17;
    if (OVar26 == bVar6) {
      uVar25 = uVar16;
    }
    puVar23[0x80] = uVar25;
    *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 8;
    uVar30 = (ulong)((uint)uVar30 | (OVar26 ^ bVar6) << 0x19 | 0x400);
    *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 2;
    bVar34 = true;
  }
LAB_0013310f:
  uVar25 = (uint)uVar30;
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar30 >> 9) & 0x1ef];
    ppoVar15 = (t1->mqc).ctxs + bVar6;
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar18 = poVar7->qeval;
    uVar12 = uVar12 - uVar18;
    if (OVar24 >> 0x10 < uVar18) {
      uVar32 = (uint)(poVar7->mps == 0);
      if (uVar18 > uVar12) {
        uVar32 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar18 <= uVar12];
      uVar12 = uVar18;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_001331b3;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_001331b3:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar18 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar32 = poVar7->mps;
      }
      else {
        uVar32 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar18) {
          uVar32 = poVar7->mps;
        }
        *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar18];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0013324f;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0013324f:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    if (uVar32 == 0) goto switchD_00131dfb_default;
  }
  uVar32 = (uint)(uVar30 >> 0x19) & 0x40 | (uint)(uVar30 >> 9) & 0xaa |
           (uint)(uVar30 >> 0x15) & 0x10 | puVar11[-1] >> 0x1c & 1 | puVar11[1] >> 0x1a & 4;
  ppoVar15 = (t1->mqc).ctxs +
             "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
             [uVar32];
  poVar7 = *ppoVar15;
  uVar18 = poVar7->qeval;
  uVar12 = uVar12 - uVar18;
  if (OVar24 >> 0x10 < uVar18) {
    uVar19 = (uint)(poVar7->mps == 0);
    if (uVar18 > uVar12) {
      uVar19 = poVar7->mps;
    }
    *ppoVar15 = (&poVar7->nmps)[uVar18 <= uVar12];
    uVar12 = uVar18;
    do {
      if (OVar29 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x200;
            OVar29 = 7;
            goto LAB_00133361;
          }
          OVar24 = OVar24 + 0xff00;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          OVar24 = OVar24 + (uint)bVar6 * 0x100;
        }
        OVar29 = 8;
      }
LAB_00133361:
      uVar12 = uVar12 * 2;
      OVar24 = OVar24 * 2;
      OVar29 = OVar29 - 1;
    } while (uVar12 < 0x8000);
  }
  else {
    OVar24 = OVar24 + uVar18 * -0x10000;
    if ((short)uVar12 < 0) {
      uVar19 = poVar7->mps;
    }
    else {
      uVar19 = (uint)(poVar7->mps == 0);
      if (uVar12 >= uVar18) {
        uVar19 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar18];
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_00133403;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_00133403:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
  }
  uVar28 = uVar19 ^ ""[uVar32];
  uVar18 = uVar17;
  if (uVar19 == ""[uVar32]) {
    uVar18 = uVar16;
  }
  puVar23[0xc0] = uVar18;
  *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 0x40;
  *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 0x10;
  puVar11[0x42] = uVar28 << 0x12 | puVar11[0x42] | 2;
  *(byte *)(puVar11 + 0x41) = (byte)puVar11[0x41] | 4;
  uVar25 = uVar25 | uVar28 << 0x1c | 0x2000;
  *(byte *)(puVar11 + 0x43) = (byte)puVar11[0x43] | 1;
switchD_00131dfb_default:
  if (uVar20 != 0) goto LAB_001334a3;
LAB_001334ad:
  iVar33 = iVar33 + 1;
  puVar10 = puVar11 + 1;
  puVar14 = puVar23 + 1;
  if (iVar33 == 0x40) goto LAB_001334d7;
  goto LAB_001316de;
LAB_001334d7:
  puVar14 = puVar23 + 0xc1;
  puVar10 = puVar11 + 3;
  bVar34 = 0x3b < uVar27;
  uVar27 = uVar27 + 4;
  if (bVar34) goto LAB_001334fe;
  goto LAB_001316d6;
switchD_0012c563_caseD_0:
  uVar20 = puVar11[1] >> 0x11 & 4 | puVar11[-1] >> 0x13 & 1;
  bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
          [uVar20];
  poVar7 = (t1->mqc).ctxs[bVar6];
  uVar25 = poVar7->qeval;
  uVar12 = uVar12 - uVar25;
  if (OVar24 >> 0x10 < uVar25) {
    uVar32 = (uint)(poVar7->mps == 0);
    if (uVar25 > uVar12) {
      uVar32 = poVar7->mps;
    }
    (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
    uVar12 = uVar25;
    do {
      if (OVar29 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x200;
            OVar29 = 7;
            goto LAB_0012c60a;
          }
          OVar24 = OVar24 + 0xff00;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          OVar24 = OVar24 + (uint)bVar6 * 0x100;
        }
        OVar29 = 8;
      }
LAB_0012c60a:
      uVar12 = uVar12 * 2;
      OVar24 = OVar24 * 2;
      OVar29 = OVar29 - 1;
    } while (uVar12 < 0x8000);
  }
  else {
    OVar24 = OVar24 + uVar25 * -0x10000;
    if ((short)uVar12 < 0) {
      uVar32 = poVar7->mps;
    }
    else {
      uVar32 = (uint)(poVar7->mps == 0);
      if (uVar12 >= uVar25) {
        uVar32 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0012d158;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0012d158:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
  }
  uVar19 = uVar32 ^ ""[uVar20];
  uVar25 = uVar17;
  if (uVar32 == ""[uVar20]) {
    uVar25 = uVar16;
  }
  *puVar23 = uVar25;
  *(byte *)(puVar11 + -1) = (byte)puVar11[-1] | 0x20;
  *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 8;
  puVar11[-0x42] = uVar19 << 0x1f | puVar11[-0x42] | 0x10000;
  *(byte *)((long)puVar11 + -0x10a) = *(byte *)((long)puVar11 + -0x10a) | 2;
  uVar30 = (ulong)(uVar19 << 0x13 | 0x10);
  *(byte *)((long)puVar11 + -0x103) = *(byte *)((long)puVar11 + -0x103) | 0x80;
switchD_0012c563_caseD_1:
  if (uVar18 == 0) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar30 >> 3) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      uVar20 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        uVar20 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0012d288;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0012d288:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar20 = poVar7->mps;
      }
      else {
        uVar20 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          uVar20 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0012d31a;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0012d31a:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    if (uVar20 != 0) goto LAB_0012d353;
    bVar34 = true;
  }
  else {
LAB_0012d353:
    uVar20 = (uint)(uVar30 >> 0x13) & 0x40 | (uint)(uVar30 >> 3) & 0xaa |
             (uint)(uVar30 >> 0xf) & 0x10 | puVar11[-1] >> 0x16 & 1 | puVar11[1] >> 0x14 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar20];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      uVar18 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        uVar18 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0012d416;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0012d416:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar18 = poVar7->mps;
      }
      else {
        uVar18 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          uVar18 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0012d4b9;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0012d4b9:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    bVar6 = ""[uVar20];
    uVar25 = uVar17;
    if (uVar18 == bVar6) {
      uVar25 = uVar16;
    }
    puVar23[0x40] = uVar25;
    *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 1;
    uVar30 = (ulong)((uint)uVar30 | (uVar18 ^ bVar6) << 0x16 | 0x80);
    *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 0x40;
    bVar34 = true;
  }
LAB_0012d52e:
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar30 >> 6) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      uVar20 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        uVar20 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0012d5c1;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0012d5c1:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar20 = poVar7->mps;
      }
      else {
        uVar20 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          uVar20 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0012d65d;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0012d65d:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    if (uVar20 != 0) goto LAB_0012d696;
    bVar34 = true;
  }
  else {
LAB_0012d696:
    uVar20 = (uint)(uVar30 >> 0x16) & 0x40 | (uint)(uVar30 >> 6) & 0xaa |
             (uint)(uVar30 >> 0x12) & 0x10 | puVar11[-1] >> 0x19 & 1 | puVar11[1] >> 0x17 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar20];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      uVar18 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        uVar18 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0012d759;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0012d759:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar18 = poVar7->mps;
      }
      else {
        uVar18 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          uVar18 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0012d7fc;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0012d7fc:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    bVar6 = ""[uVar20];
    uVar25 = uVar17;
    if (uVar18 == bVar6) {
      uVar25 = uVar16;
    }
    puVar23[0x80] = uVar25;
    *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 8;
    uVar30 = (ulong)((uint)uVar30 | (uVar18 ^ bVar6) << 0x19 | 0x400);
    *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 2;
    bVar34 = true;
  }
LAB_0012d86c:
  uVar25 = (uint)uVar30;
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar30 >> 9) & 0x1ef];
    ppoVar15 = (t1->mqc).ctxs + bVar6;
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar20 = poVar7->qeval;
    uVar12 = uVar12 - uVar20;
    if (OVar24 >> 0x10 < uVar20) {
      uVar18 = (uint)(poVar7->mps == 0);
      if (uVar20 > uVar12) {
        uVar18 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
      uVar12 = uVar20;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0012d90e;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0012d90e:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar20 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar18 = poVar7->mps;
      }
      else {
        uVar18 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar20) {
          uVar18 = poVar7->mps;
        }
        *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0012d9b3;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0012d9b3:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    if (uVar18 == 0) goto switchD_0012c563_default;
  }
  uVar18 = (uint)(uVar30 >> 0x19) & 0x40 | (uint)(uVar30 >> 9) & 0xaa |
           (uint)(uVar30 >> 0x15) & 0x10 | puVar11[-1] >> 0x1c & 1 | puVar11[1] >> 0x1a & 4;
  ppoVar15 = (t1->mqc).ctxs +
             "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
             [uVar18];
  poVar7 = *ppoVar15;
  uVar20 = poVar7->qeval;
  uVar12 = uVar12 - uVar20;
  if (OVar24 >> 0x10 < uVar20) {
    uVar32 = (uint)(poVar7->mps == 0);
    if (uVar20 > uVar12) {
      uVar32 = poVar7->mps;
    }
    *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
    uVar12 = uVar20;
    do {
      if (OVar29 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x200;
            OVar29 = 7;
            goto LAB_0012dab0;
          }
          OVar24 = OVar24 + 0xff00;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          OVar24 = OVar24 + (uint)bVar6 * 0x100;
        }
        OVar29 = 8;
      }
LAB_0012dab0:
      uVar12 = uVar12 * 2;
      OVar24 = OVar24 * 2;
      OVar29 = OVar29 - 1;
    } while (uVar12 < 0x8000);
  }
  else {
    OVar24 = OVar24 + uVar20 * -0x10000;
    if ((short)uVar12 < 0) {
      uVar32 = poVar7->mps;
    }
    else {
      uVar32 = (uint)(poVar7->mps == 0);
      if (uVar12 >= uVar20) {
        uVar32 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0012db4d;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0012db4d:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
  }
  uVar19 = uVar32 ^ ""[uVar18];
  uVar20 = uVar17;
  if (uVar32 == ""[uVar18]) {
    uVar20 = uVar16;
  }
  puVar23[0xc0] = uVar20;
  *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 0x40;
  *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 0x10;
  puVar11[0x42] = uVar19 << 0x12 | puVar11[0x42] | 2;
  *(byte *)(puVar11 + 0x41) = (byte)puVar11[0x41] | 4;
  uVar25 = uVar25 | uVar19 << 0x1c | 0x2000;
  *(byte *)(puVar11 + 0x43) = (byte)puVar11[0x43] | 1;
switchD_0012c563_default:
  if (OVar26 != 0) goto LAB_0012dbeb;
LAB_0012dbf6:
  iVar33 = iVar33 + 1;
  puVar10 = puVar11 + 1;
  puVar14 = puVar23 + 1;
  if (iVar33 == 0x40) goto LAB_0012dc20;
  goto LAB_0012be82;
LAB_0012dc20:
  puVar14 = puVar23 + 0xc1;
  puVar10 = puVar11 + 3;
  bVar34 = 0x3b < uVar27;
  uVar27 = uVar27 + 4;
  if (bVar34) goto LAB_001334fe;
  goto LAB_0012be7a;
LAB_001334fe:
  (t1->mqc).curctx = ppoVar15;
  (t1->mqc).c = OVar24;
  (t1->mqc).a = uVar12;
  (t1->mqc).ct = OVar29;
  goto LAB_00133514;
}

Assistant:

static void opj_t1_dec_clnpass(
    opj_t1_t *t1,
    OPJ_INT32 bpno,
    OPJ_INT32 cblksty)
{
    if (t1->w == 64 && t1->h == 64) {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_clnpass_64x64_vsc(t1, bpno);
        } else {
            opj_t1_dec_clnpass_64x64_novsc(t1, bpno);
        }
    } else {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_clnpass_generic_vsc(t1, bpno);
        } else {
            opj_t1_dec_clnpass_generic_novsc(t1, bpno);
        }
    }
    opj_t1_dec_clnpass_check_segsym(t1, cblksty);
}